

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O0

int who(vector<cUser,_std::allocator<cUser>_> *currUsers,int new_fd)

{
  bool bVar1;
  reference paVar2;
  ulong uVar3;
  void *__buf;
  ssize_t sVar4;
  string local_b0 [48];
  undefined1 local_80 [8];
  cUser user;
  iterator __end1;
  iterator __begin1;
  vector<cUser,_std::allocator<cUser>_> *__range1;
  string names;
  int new_fd_local;
  vector<cUser,_std::allocator<cUser>_> *currUsers_local;
  
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::vector<cUser,_std::allocator<cUser>_>::begin(currUsers);
  user._32_8_ = std::vector<cUser,_std::allocator<cUser>_>::end(currUsers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>
                                *)&user.id);
    if (!bVar1) break;
    paVar2 = __gnu_cxx::__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>::
             operator*(&__end1);
    anon_struct_40_2_6a8bb0e8::cUser((anon_struct_40_2_6a8bb0e8 *)local_80,paVar2);
    std::operator+((char *)local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x118219);
    std::__cxx11::string::operator+=((string *)&__range1,local_b0);
    std::__cxx11::string::~string(local_b0);
    anon_struct_40_2_6a8bb0e8::~cUser((anon_struct_40_2_6a8bb0e8 *)local_80);
    __gnu_cxx::__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>::operator++
              (&__end1);
  }
  uVar3 = std::__cxx11::string::length();
  if (uVar3 < 0x100) {
    __buf = (void *)std::__cxx11::string::c_str();
    sVar4 = send(new_fd,__buf,0xff,0);
    if (sVar4 == -1) {
      perror("send");
    }
    currUsers_local._4_4_ = 1;
  }
  else {
    std::operator<<((ostream *)&std::cerr,"We in some trouble with this");
    currUsers_local._4_4_ = 0;
  }
  std::__cxx11::string::~string((string *)&__range1);
  return currUsers_local._4_4_;
}

Assistant:

int who(vector<cUser>& currUsers,int new_fd){
    string names;

    // add all the currently logged in user's names to the string
    for(cUser user : currUsers){
        names += (" " + user.username);
    }

    // make sure its not to long
    if(names.length() > MAXDATASIZE - 1){
        cerr << "We in some trouble with this";
        return 0;
    }

    //send it back to the client
    if (send(new_fd, names.c_str(), MAXDATASIZE - 1, 0) == -1)
        perror("send");

    return 1;

}